

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::FileDescriptorProto::_InternalParse
          (FileDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  DescriptorProto *in_RDX;
  char *in_RSI;
  FileDescriptorProto *in_RDI;
  uint32 tag;
  Arena *arena;
  HasBits has_bits;
  undefined4 in_stack_ffffffffffffff78;
  int32 in_stack_ffffffffffffff7c;
  DescriptorProto *in_stack_ffffffffffffff80;
  DescriptorProto *in_stack_ffffffffffffff88;
  DescriptorProto *in_stack_ffffffffffffff90;
  DescriptorProto *in_stack_ffffffffffffff98;
  DescriptorProto *in_stack_ffffffffffffffa0;
  DescriptorProto *in_stack_ffffffffffffffa8;
  uint local_3c;
  HasBits<1UL> local_2c;
  DescriptorProto *local_28;
  char *local_20;
  HasBits<1UL> *local_10;
  HasBits<1UL> *local_8;
  
  local_10 = &local_2c;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_8 = local_10;
  memset(local_10,0,4);
  GetArenaNoVirtual((FileDescriptorProto *)in_stack_ffffffffffffff80);
LAB_005060ea:
  do {
    bVar1 = internal::ParseContext::Done
                      ((ParseContext *)in_stack_ffffffffffffff80,
                       (char **)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_00506896;
    local_20 = internal::ReadTag((char *)in_stack_ffffffffffffffa8,
                                 (uint32 *)in_stack_ffffffffffffffa0,
                                 (uint32)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    if (local_20 == (char *)0x0) goto LAB_005068b6;
    switch(local_3c >> 3) {
    case 1:
      if ((local_3c & 0xff) != 10) break;
      _internal_mutable_name_abi_cxx11_((FileDescriptorProto *)in_stack_ffffffffffffff90);
      local_20 = internal::InlineGreedyStringParserUTF8Verify
                           ((string *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                            (ParseContext *)in_stack_ffffffffffffff90,
                            (char *)in_stack_ffffffffffffff88);
      goto joined_r0x00506824;
    case 2:
      if ((local_3c & 0xff) == 0x12) {
        _internal_mutable_package_abi_cxx11_((FileDescriptorProto *)in_stack_ffffffffffffff90);
        local_20 = internal::InlineGreedyStringParserUTF8Verify
                             ((string *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                              (ParseContext *)in_stack_ffffffffffffff90,
                              (char *)in_stack_ffffffffffffff88);
        goto joined_r0x00506824;
      }
      break;
    case 3:
      if ((local_3c & 0xff) == 0x1a) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          _internal_add_dependency_abi_cxx11_((FileDescriptorProto *)0x506260);
          local_20 = internal::InlineGreedyStringParserUTF8Verify
                               ((string *)in_stack_ffffffffffffffa0,
                                (char *)in_stack_ffffffffffffff98,
                                (ParseContext *)in_stack_ffffffffffffff90,
                                (char *)in_stack_ffffffffffffff88);
          if (local_20 == (char *)0x0) goto LAB_005068b6;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            ((EpsCopyInputStream *)local_28,local_20);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<26u>(local_20), bVar1));
        goto LAB_005060ea;
      }
      break;
    case 4:
      if ((local_3c & 0xff) == 0x22) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          in_stack_ffffffffffffffa8 = local_28;
          _internal_add_message_type((FileDescriptorProto *)0x50630f);
          local_20 = internal::ParseContext::ParseMessage<google::protobuf::DescriptorProto>
                               ((ParseContext *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                                (char *)in_stack_ffffffffffffff88);
          if (local_20 == (char *)0x0) goto LAB_005068b6;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            ((EpsCopyInputStream *)local_28,local_20);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<34u>(local_20), bVar1));
        goto LAB_005060ea;
      }
      break;
    case 5:
      if ((local_3c & 0xff) == 0x2a) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          in_stack_ffffffffffffffa0 = local_28;
          _internal_add_enum_type((FileDescriptorProto *)0x5063b7);
          local_20 = internal::ParseContext::ParseMessage<google::protobuf::EnumDescriptorProto>
                               ((ParseContext *)in_stack_ffffffffffffff98,
                                (EnumDescriptorProto *)in_stack_ffffffffffffff90,
                                (char *)in_stack_ffffffffffffff88);
          if (local_20 == (char *)0x0) goto LAB_005068b6;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            ((EpsCopyInputStream *)local_28,local_20);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<42u>(local_20), bVar1));
        goto LAB_005060ea;
      }
      break;
    case 6:
      if ((local_3c & 0xff) == 0x32) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          in_stack_ffffffffffffff98 = local_28;
          _internal_add_service((FileDescriptorProto *)0x50645f);
          local_20 = internal::ParseContext::ParseMessage<google::protobuf::ServiceDescriptorProto>
                               ((ParseContext *)in_stack_ffffffffffffff98,
                                (ServiceDescriptorProto *)in_stack_ffffffffffffff90,
                                (char *)in_stack_ffffffffffffff88);
          if (local_20 == (char *)0x0) goto LAB_005068b6;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            ((EpsCopyInputStream *)local_28,local_20);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<50u>(local_20), bVar1));
        goto LAB_005060ea;
      }
      break;
    case 7:
      if ((local_3c & 0xff) == 0x3a) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          in_stack_ffffffffffffff90 = local_28;
          _internal_add_extension((FileDescriptorProto *)0x506507);
          local_20 = internal::ParseContext::ParseMessage<google::protobuf::FieldDescriptorProto>
                               ((ParseContext *)in_stack_ffffffffffffff98,
                                (FieldDescriptorProto *)in_stack_ffffffffffffff90,
                                (char *)in_stack_ffffffffffffff88);
          if (local_20 == (char *)0x0) goto LAB_005068b6;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            ((EpsCopyInputStream *)local_28,local_20);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<58u>(local_20), bVar1));
        goto LAB_005060ea;
      }
      break;
    case 8:
      if ((local_3c & 0xff) == 0x42) {
        in_stack_ffffffffffffff88 = local_28;
        _internal_mutable_options((FileDescriptorProto *)in_stack_ffffffffffffff80);
        local_20 = internal::ParseContext::ParseMessage<google::protobuf::FileOptions>
                             ((ParseContext *)in_stack_ffffffffffffff98,
                              (FileOptions *)in_stack_ffffffffffffff90,
                              (char *)in_stack_ffffffffffffff88);
        goto joined_r0x00506824;
      }
      break;
    case 9:
      if ((local_3c & 0xff) == 0x4a) {
        in_stack_ffffffffffffff80 = local_28;
        _internal_mutable_source_code_info((FileDescriptorProto *)local_28);
        local_20 = internal::ParseContext::ParseMessage<google::protobuf::SourceCodeInfo>
                             ((ParseContext *)in_stack_ffffffffffffff98,
                              (SourceCodeInfo *)in_stack_ffffffffffffff90,
                              (char *)in_stack_ffffffffffffff88);
        goto joined_r0x00506824;
      }
      break;
    case 10:
      if ((local_3c & 0xff) == 0x50) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          internal::ReadVarint((char **)in_stack_ffffffffffffff80);
          _internal_add_public_dependency
                    ((FileDescriptorProto *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
          if (local_20 == (char *)0x0) goto LAB_005068b6;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            ((EpsCopyInputStream *)local_28,local_20);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<80u>(local_20), bVar1));
        goto LAB_005060ea;
      }
      if ((local_3c & 0xff) == 0x52) {
        _internal_mutable_public_dependency(in_RDI);
        local_20 = internal::PackedInt32Parser
                             (in_stack_ffffffffffffff80,
                              (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                              (ParseContext *)0x5066db);
        goto joined_r0x00506824;
      }
      break;
    case 0xb:
      if ((local_3c & 0xff) == 0x58) {
        local_20 = local_20 + -1;
        do {
          local_20 = local_20 + 1;
          internal::ReadVarint((char **)in_stack_ffffffffffffff80);
          _internal_add_weak_dependency
                    ((FileDescriptorProto *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
          if (local_20 == (char *)0x0) goto LAB_005068b6;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            ((EpsCopyInputStream *)local_28,local_20);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<88u>(local_20), bVar1));
        goto LAB_005060ea;
      }
      if ((local_3c & 0xff) == 0x5a) {
        _internal_mutable_weak_dependency(in_RDI);
        local_20 = internal::PackedInt32Parser
                             (in_stack_ffffffffffffff80,
                              (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                              (ParseContext *)0x5067b2);
        goto joined_r0x00506824;
      }
      break;
    case 0xc:
      if ((local_3c & 0xff) == 0x62) {
        _internal_mutable_syntax_abi_cxx11_((FileDescriptorProto *)in_stack_ffffffffffffff90);
        local_20 = internal::InlineGreedyStringParserUTF8Verify
                             ((string *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                              (ParseContext *)in_stack_ffffffffffffff90,
                              (char *)in_stack_ffffffffffffff88);
        goto joined_r0x00506824;
      }
    }
    if (((local_3c & 7) == 4) || (local_3c == 0)) {
      internal::EpsCopyInputStream::SetLastTag((EpsCopyInputStream *)local_28,local_3c);
      goto LAB_00506896;
    }
    local_20 = internal::UnknownFieldParse
                         ((uint32)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                          (InternalMetadataWithArena *)in_stack_ffffffffffffff98,
                          (char *)in_stack_ffffffffffffff90,
                          (ParseContext *)in_stack_ffffffffffffff88);
joined_r0x00506824:
    if (local_20 == (char *)0x0) {
LAB_005068b6:
      local_20 = (char *)0x0;
LAB_00506896:
      internal::HasBits<1UL>::Or(&in_RDI->_has_bits_,&local_2c);
      return local_20;
    }
  } while( true );
}

Assistant:

const char* FileDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.FileDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string package = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_package(), ptr, ctx, "google.protobuf.FileDescriptorProto.package");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated string dependency = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_dependency(), ptr, ctx, "google.protobuf.FileDescriptorProto.dependency");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto message_type = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_message_type(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_enum_type(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<42>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.ServiceDescriptorProto service = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_service(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<50>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.FieldDescriptorProto extension = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_extension(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<58>(ptr));
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FileOptions options = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 74)) {
          ptr = ctx->ParseMessage(_internal_mutable_source_code_info(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated int32 public_dependency = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 80)) {
          ptr -= 1;
          do {
            ptr += 1;
            _internal_add_public_dependency(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr));
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<80>(ptr));
        } else if (static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 82) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt32Parser(_internal_mutable_public_dependency(), ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated int32 weak_dependency = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 88)) {
          ptr -= 1;
          do {
            ptr += 1;
            _internal_add_weak_dependency(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr));
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<88>(ptr));
        } else if (static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 90) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt32Parser(_internal_mutable_weak_dependency(), ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string syntax = 12;
      case 12:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 98)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_syntax(), ptr, ctx, "google.protobuf.FileDescriptorProto.syntax");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}